

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

bool __thiscall
Potassco::ProgramOptions::Value::parse(Value *this,string *name,string *value,State st)

{
  byte_t bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  Value *pVVar5;
  char *pcVar6;
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((value->_M_string_length == 0) && ((this->flags_ & 1) != 0)) {
    bVar1 = this->descFlag_;
    if ((bVar1 == '\b') || (bVar1 == '\x04')) {
      pVVar5 = this;
      if (bVar1 != '\x04') {
        pVVar5 = (Value *)(this->desc_).value;
      }
      pcVar4 = (pVVar5->desc_).value;
    }
    else {
      pcVar4 = (char *)0x0;
    }
    pcVar6 = "1";
    if (pcVar4 != (char *)0x0) {
      pcVar6 = pcVar4;
    }
    std::__cxx11::string::string((string *)local_48,pcVar6,&local_49);
    iVar3 = (*this->_vptr_Value[2])(this,name,(string *)local_48);
    cVar2 = (char)iVar3;
    if (cVar2 != '\0') {
      this->state_ = (byte_t)st;
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  else {
    iVar3 = (*this->_vptr_Value[2])(this,name);
    cVar2 = (char)iVar3;
    if (cVar2 != '\0') {
      this->state_ = (byte_t)st;
    }
  }
  return (bool)cVar2;
}

Assistant:

bool Value::parse(const std::string& name, const std::string& value, State st) {
	if (!value.empty() || !isImplicit()) return state(doParse(name, value), st);
	const char* x = implicit();
	assert(x);
	return state(doParse(name, x), st);
}